

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O1

int32_t uscript_getCode_63(char *nameOrAbbrOrLocale,UScriptCode *fillIn,int32_t capacity,
                          UErrorCode *err)

{
  bool bVar1;
  int32_t iVar2;
  UScriptCode UVar3;
  char *pcVar4;
  UErrorCode internalErrorCode;
  char likely [157];
  int32_t local_e0;
  UErrorCode local_dc;
  char local_d8 [168];
  
  iVar2 = 0;
  if (U_ZERO_ERROR < *err) {
    return iVar2;
  }
  if (nameOrAbbrOrLocale == (char *)0x0) {
LAB_002f9c9f:
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (fillIn == (UScriptCode *)0x0) {
      if (capacity != 0) goto LAB_002f9c9f;
    }
    else if (capacity < 0) goto LAB_002f9c9f;
    pcVar4 = strchr(nameOrAbbrOrLocale,0x2d);
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(nameOrAbbrOrLocale,0x5f), pcVar4 == (char *)0x0)
       ) {
      UVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,nameOrAbbrOrLocale);
      if (UVar3 == USCRIPT_INVALID_CODE) {
        bVar1 = true;
        local_e0 = -1;
      }
      else {
        bVar1 = false;
        local_e0 = 0;
        if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
          if (capacity < 1) {
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          else {
            *fillIn = UVar3;
          }
          local_e0 = 1;
          bVar1 = false;
        }
      }
      if (UVar3 != USCRIPT_INVALID_CODE) {
        return local_e0;
      }
    }
    else {
      bVar1 = false;
    }
    local_dc = U_ZERO_ERROR;
    iVar2 = getCodesFromLocale(nameOrAbbrOrLocale,fillIn,capacity,err);
    if (((iVar2 == 0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) &&
       ((uloc_addLikelySubtags_63(nameOrAbbrOrLocale,local_d8,0x9d,&local_dc),
        local_dc == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < local_dc ||
        ((iVar2 = getCodesFromLocale(local_d8,fillIn,capacity,err), iVar2 == 0 &&
         (*err < U_ILLEGAL_ARGUMENT_ERROR)))))) {
      if (!bVar1) {
        UVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,nameOrAbbrOrLocale);
        if ((UVar3 != USCRIPT_INVALID_CODE) && (local_e0 = 0, *err < U_ILLEGAL_ARGUMENT_ERROR)) {
          if (capacity < 1) {
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          else {
            *fillIn = UVar3;
          }
          local_e0 = 1;
        }
        if (UVar3 != USCRIPT_INVALID_CODE) {
          return local_e0;
        }
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uscript_getCode(const char* nameOrAbbrOrLocale,
                UScriptCode* fillIn,
                int32_t capacity,
                UErrorCode* err){
    UBool triedCode;
    char likely[ULOC_FULLNAME_CAPACITY];
    UErrorCode internalErrorCode;
    int32_t length;

    if(U_FAILURE(*err)) {
        return 0;
    }
    if(nameOrAbbrOrLocale==NULL ||
            (fillIn == NULL ? capacity != 0 : capacity < 0)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    triedCode = FALSE;
    if(uprv_strchr(nameOrAbbrOrLocale, '-')==NULL && uprv_strchr(nameOrAbbrOrLocale, '_')==NULL ){
        /* try long and abbreviated script names first */
        UScriptCode code = (UScriptCode) u_getPropertyValueEnum(UCHAR_SCRIPT, nameOrAbbrOrLocale);
        if(code!=USCRIPT_INVALID_CODE) {
            return setOneCode(code, fillIn, capacity, err);
        }
        triedCode = TRUE;
    }
    internalErrorCode = U_ZERO_ERROR;
    length = getCodesFromLocale(nameOrAbbrOrLocale, fillIn, capacity, err);
    if(U_FAILURE(*err) || length != 0) {
        return length;
    }
    (void)uloc_addLikelySubtags(nameOrAbbrOrLocale,
                                likely, UPRV_LENGTHOF(likely), &internalErrorCode);
    if(U_SUCCESS(internalErrorCode) && internalErrorCode != U_STRING_NOT_TERMINATED_WARNING) {
        length = getCodesFromLocale(likely, fillIn, capacity, err);
        if(U_FAILURE(*err) || length != 0) {
            return length;
        }
    }
    if(!triedCode) {
        /* still not found .. try long and abbreviated script names again */
        UScriptCode code = (UScriptCode) u_getPropertyValueEnum(UCHAR_SCRIPT, nameOrAbbrOrLocale);
        if(code!=USCRIPT_INVALID_CODE) {
            return setOneCode(code, fillIn, capacity, err);
        }
    }
    return 0;
}